

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeHolder::attach(CodeHolder *this,CodeEmitter *emitter)

{
  byte bVar1;
  long *in_RSI;
  long in_RDI;
  Error err;
  CodeEmitter **pSlot;
  uint32_t type;
  undefined8 *local_40;
  Error local_1c;
  
  if (in_RSI == (long *)0x0) {
    local_1c = 3;
  }
  else {
    bVar1 = *(byte *)(in_RSI + 5);
    if ((bVar1 == 0) || (3 < bVar1)) {
      local_1c = 4;
    }
    else if (in_RSI[3] == 0) {
      local_40 = (undefined8 *)0x0;
      if (bVar1 == 1) {
        if (*(long *)(in_RDI + 0x20) != 0) {
          return 9;
        }
        local_40 = (undefined8 *)(in_RDI + 0x20);
      }
      local_1c = (**(code **)(*in_RSI + 0x10))(in_RSI,in_RDI);
      if (local_1c == 0) {
        in_RSI[4] = *(long *)(in_RDI + 0x18);
        *(long **)(in_RDI + 0x18) = in_RSI;
        if (local_40 != (undefined8 *)0x0) {
          *local_40 = in_RSI;
        }
        in_RSI[3] = in_RDI;
        local_1c = 0;
      }
    }
    else if (in_RSI[3] == in_RDI) {
      local_1c = 0;
    }
    else {
      local_1c = 4;
    }
  }
  return local_1c;
}

Assistant:

Error CodeHolder::attach(CodeEmitter* emitter) noexcept {
  // Catch a possible misuse of the API.
  if (!emitter)
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t type = emitter->getType();
  if (type == CodeEmitter::kTypeNone || type >= CodeEmitter::kTypeCount)
    return DebugUtils::errored(kErrorInvalidState);

  // This is suspicious, but don't fail if `emitter` matches.
  if (emitter->_code != nullptr) {
    if (emitter->_code == this) return kErrorOk;
    return DebugUtils::errored(kErrorInvalidState);
  }

  // Special case - attach `Assembler`.
  CodeEmitter** pSlot = nullptr;
  if (type == CodeEmitter::kTypeAssembler) {
    if (_cgAsm)
      return DebugUtils::errored(kErrorSlotOccupied);
    pSlot = reinterpret_cast<CodeEmitter**>(&_cgAsm);
  }

  Error err = emitter->onAttach(this);
  if (err != kErrorOk) return err;

  // Add to a single-linked list of `CodeEmitter`s.
  emitter->_nextEmitter = _emitters;
  _emitters = emitter;
  if (pSlot) *pSlot = emitter;

  // Establish the connection.
  emitter->_code = this;
  return kErrorOk;
}